

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioSetAlertFuncEx(uint gpio,gpioAlertFuncEx_t f,void *userdata)

{
  char *pcVar1;
  void *in_RDX;
  ulong in_RSI;
  uint in_EDI;
  void *in_stack_ffffffffffffffd8;
  FILE *pFVar2;
  undefined8 in_stack_ffffffffffffffe0;
  int user;
  int local_4;
  
  user = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pFVar2 = _stderr;
    pcVar1 = myTimeStamp();
    fprintf(pFVar2,"%s %s: gpio=%d function=%08X userdata=%08X\n",pcVar1,"gpioSetAlertFuncEx",
            (ulong)in_EDI,in_RSI & 0xffffffff,(int)in_RDX);
    user = (int)((ulong)pFVar2 >> 0x20);
  }
  pFVar2 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar1 = myTimeStamp();
      fprintf(pFVar2,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar1,
              "gpioSetAlertFuncEx");
    }
    local_4 = -0x1f;
  }
  else if (in_EDI < 0x20) {
    intGpioSetAlertFunc((uint)(in_RSI >> 0x20),in_RDX,user,in_stack_ffffffffffffffd8);
    local_4 = 0;
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar1 = myTimeStamp();
      fprintf(pFVar2,"%s %s: bad gpio (%d)\n",pcVar1,"gpioSetAlertFuncEx",(ulong)in_EDI);
    }
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int gpioSetAlertFuncEx(unsigned gpio, gpioAlertFuncEx_t f, void *userdata)
{
   DBG(DBG_USER, "gpio=%d function=%08X userdata=%08X",
      gpio, (uint32_t)f, (uint32_t)userdata);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   intGpioSetAlertFunc(gpio, f, 1, userdata);

   return 0;
}